

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime * __thiscall QDateTime::operator=(QDateTime *this,QDateTime *other)

{
  QDateTime *in_RDI;
  Data *in_stack_00000020;
  Data *in_stack_00000028;
  
  Data::operator=(in_stack_00000028,in_stack_00000020);
  return in_RDI;
}

Assistant:

QDateTime &QDateTime::operator=(const QDateTime &other) noexcept
{
    d = other.d;
    return *this;
}